

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

int __thiscall Player::attack(Player *this)

{
  Country *this_00;
  pointer ppCVar1;
  Country *toCountry;
  Player *defendingPlayer;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  reference ppCVar6;
  GameLoop *pGVar7;
  pointer ppPVar8;
  int iVar9;
  char *pcVar10;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar11;
  long lVar12;
  Country **neighbour;
  pointer ppCVar13;
  int local_68;
  string local_50;
  
  local_68 = 0;
  setPlayerState(this,ATTACKING);
  notifyAll(this);
  PlayerStrategy::getStrategyName_abi_cxx11_(&local_50,this->strategy);
  bVar2 = std::operator==(&local_50,"CHEATER");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    iVar3 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,0);
    iVar3 = (int)(char)iVar3;
  }
  else {
LAB_0010b185:
    while (local_68 != 10) {
      local_68 = local_68 + 1;
      std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13c520);
      poVar5 = std::operator<<((ostream *)&std::cout,"It is Player ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this->pPlayerId);
      poVar5 = std::operator<<(poVar5,"\'s turn to attack!");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::operator<<((ostream *)&std::cout,"\n[ATTACKER] Will you attack?(y/n)");
      uVar4 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,0);
      if ((char)uVar4 == 'y') {
        poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this->pPlayerId);
        poVar5 = std::operator<<(poVar5," has chosen to attack!");
        std::endl<char,std::char_traits<char>>(poVar5);
        do {
          while( true ) {
            std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13c520);
            std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
                      ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_50,
                       this->pOwnedCountries);
            showCountries((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_50);
            std::_Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>::~_Vector_base
                      ((_Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_> *)&local_50);
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "\n[ATTACKER] From which country do you want to attack?(choose 0 to "
                                    );
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5,")");
            uVar4 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,1);
            if (-1 < (int)uVar4) break;
            std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
          }
          pvVar11 = this->pOwnedCountries;
          iVar3 = (int)((ulong)((long)(pvVar11->
                                      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar11->
                                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
          if ((iVar3 <= (int)uVar4) ||
             (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) != 0)) {
            std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
            pvVar11 = this->pOwnedCountries;
            iVar3 = (int)((ulong)((long)(pvVar11->
                                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar11->
                                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3);
          }
        } while ((iVar3 <= (int)uVar4) ||
                (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) != 0));
        ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pvVar11,(ulong)uVar4);
        this_00 = *ppCVar6;
        if (*this_00->pNumberOfTroops < 2) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Country ");
          Map::Country::getCountryName_abi_cxx11_(&local_50,this_00);
          poVar5 = std::operator<<(poVar5,(string *)&local_50);
          std::operator<<(poVar5,
                          " does not have enough armies to attack. Choose a different country. Proceeding...\n"
                         );
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          do {
            while( true ) {
              std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13c520);
              poVar5 = std::operator<<((ostream *)&std::cout,"\nCountry ");
              Map::Country::getCountryName_abi_cxx11_(&local_50,this_00);
              poVar5 = std::operator<<(poVar5,(string *)&local_50);
              poVar5 = std::operator<<(poVar5," has ");
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::operator<<(poVar5," neighbour(s):\n");
              std::__cxx11::string::~string((string *)&local_50);
              ppCVar1 = (this_00->pAdjCountries->
                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish;
              for (ppCVar13 = (this_00->pAdjCountries->
                              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                              _M_impl.super__Vector_impl_data._M_start; ppCVar13 != ppCVar1;
                  ppCVar13 = ppCVar13 + 1) {
                poVar5 = std::operator<<((ostream *)&std::cout,"\t\tName: ");
                Map::Country::getCountryName_abi_cxx11_(&local_50,*ppCVar13);
                poVar5 = std::operator<<(poVar5,(string *)&local_50);
                poVar5 = std::operator<<(poVar5," Armies: ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(*ppCVar13)->pNumberOfTroops);
                poVar5 = std::operator<<(poVar5," Owned by: Player ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(*ppCVar13)->pPlayerOwnerId);
                std::endl<char,std::char_traits<char>>(poVar5);
                std::__cxx11::string::~string((string *)&local_50);
              }
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "\n[ATTACKER] Which country would you like to attack?(0 to ")
              ;
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::operator<<(poVar5,")");
              uVar4 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,2);
              if (-1 < (int)uVar4) break;
              std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
            }
            pvVar11 = this_00->pAdjCountries;
            iVar3 = (int)((ulong)((long)(pvVar11->
                                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar11->
                                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3);
            if ((iVar3 < (int)uVar4) ||
               (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) != 0)) {
              std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
              pvVar11 = this_00->pAdjCountries;
              iVar3 = (int)((ulong)((long)(pvVar11->
                                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar11->
                                         super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3);
            }
          } while ((iVar3 < (int)uVar4) ||
                  (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) != 0));
          ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                              (pvVar11,(ulong)uVar4);
          toCountry = *ppCVar6;
          if (*this_00->pPlayerOwnerId != *toCountry->pPlayerOwnerId) {
            do {
              while( true ) {
                std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13c520);
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "\n[ATTACKER] How many dice will Player ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this->pPlayerId);
                std::operator<<(poVar5," roll?(1 to ");
                if (*this_00->pNumberOfTroops < 4) {
                  poVar5 = (ostream *)
                           std::ostream::operator<<(&std::cout,*this_00->pNumberOfTroops + -1);
                  pcVar10 = ")";
                }
                else {
                  poVar5 = (ostream *)&std::cout;
                  pcVar10 = "3)";
                }
                std::operator<<(poVar5,pcVar10);
                uVar4 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,3);
                if (0 < (int)uVar4) break;
                std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
              }
              if (((3 < uVar4) || (iVar3 = *this_00->pNumberOfTroops, iVar3 <= (int)uVar4)) ||
                 (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) != 0)) {
                std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
                iVar3 = *this_00->pNumberOfTroops;
              }
            } while (((3 < uVar4) || (iVar3 <= (int)uVar4)) ||
                    (lVar12 = *(long *)(std::cin + -0x18),
                    ((byte)std::__cxx11::wstring::resize[lVar12] & 5) != 0));
            do {
              std::ios::clear((int)lVar12 + 0x13c520);
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "\n[DEFENDER] How many dice will Player ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*toCountry->pPlayerOwnerId);
              std::operator<<(poVar5," roll?(1 to ");
              pcVar10 = "1)";
              if (1 < *toCountry->pNumberOfTroops) {
                pcVar10 = "2)";
              }
              std::operator<<((ostream *)&std::cout,pcVar10);
              iVar3 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,5);
              if (iVar3 - 3U < 0xfffffffe) {
                std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
              }
              else {
                iVar9 = *toCountry->pNumberOfTroops;
                if ((iVar9 < iVar3) ||
                   (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) != 0)) {
                  std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
                  iVar9 = *toCountry->pNumberOfTroops;
                }
                if ((iVar3 <= iVar9) &&
                   (((byte)std::__cxx11::wstring::resize[*(long *)(std::cin + -0x18)] & 5) == 0))
                goto code_r0x0010b7af;
              }
              lVar12 = *(long *)(std::cin + -0x18);
            } while( true );
          }
          std::operator<<((ostream *)&std::cout,
                          "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n");
        }
      }
      else {
        if ((uVar4 & 0xff) == 0x6e) {
          poVar5 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*this->pPlayerId);
          poVar5 = std::operator<<(poVar5," has chosen NOT to attack!");
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_0010b886;
        }
        std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
      }
    }
    std::operator<<((ostream *)&std::cout,
                    "\nInvalid user input for 10 consecutive prompts, aborting action.\n");
LAB_0010b886:
    setPlayerState(this,IDLE);
    (*this->strategy->_vptr_PlayerStrategy[5])();
    iVar3 = 0;
  }
  return iVar3;
code_r0x0010b7af:
  pGVar7 = GameLoop::getInstance();
  ppPVar8 = (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppPVar8 ==
        (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      setPlayerState(this,IDLE);
      (*this->strategy->_vptr_PlayerStrategy[5])();
      return -1;
    }
    defendingPlayer = *ppPVar8;
    ppPVar8 = ppPVar8 + 1;
  } while (*defendingPlayer->pPlayerId != *toCountry->pPlayerOwnerId);
  iVar3 = executeAttack(this,this_00,toCountry,defendingPlayer,uVar4,iVar3);
  if (iVar3 == 1) {
    pcVar10 = "\n[ATTACK SUCCEEDED] - Proceeding.";
  }
  else {
    pcVar10 = "\n[ATTACK FAILED] - Make sure that you chose appropriate values.";
  }
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar5);
  goto LAB_0010b185;
}

Assistant:

int Player::attack() {

    char playerChoice = 0;
    int fromCountryIndex;
    int toCountryIndex;
    int numAttackingDice;
    int numDefendingDice;

    this->setPlayerState(PlayerState::ATTACKING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::ATTACK);
    }

    /* USER DECISION TO ATTACK OR NOT*/
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }
        failsafeCounter++;

        std::cin.clear();
        std::cout << "It is Player " << this->getPlayerId() << "'s turn to attack!" << std::endl;
        std::cout << "\n[ATTACKER] Will you attack?(y/n)";
        playerChoice = strategy->yesOrNo(StrategyContext::ATTACK);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid Input. Please try again.\n";
            continue;
        }

        if (playerChoice == 'y') {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to attack!" << std::endl;
            /*USER CHOOSES FROM WHICH COUNTRY TO ATTACK*/
            fromCountryIndex = getAttackingCountry(this);
        } else {
            std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to attack!" << std::endl;
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::ABORTED;
        }

        // Get the country to attack from
        Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
        if (fromCountry->getNumberOfTroops() < 2) {
            std::cout << "Country " << fromCountry->getCountryName()
                      << " does not have enough armies to attack. Choose a different country. Proceeding...\n";
            continue;
        }

        /* USER CHOOSES WHICH COUNTRY TO ATTACK*/
        toCountryIndex = getDefendingCountry(fromCountry, this);

        Map::Country *toCountry = fromCountry->getAdjCountries()->at(toCountryIndex);
        if (fromCountry->getPlayerOwnerID() == toCountry->getPlayerOwnerID()) {
            std::cout << "\n[ATTACKER] You cannot attack your own country! Proceeding...\n\n";
            continue;
        }

        /*ATTACKER CHOOSES HOW MANY DICE TO ROLL*/
        numAttackingDice = getNumAttackingDice(this, fromCountry);

        /*DEFENDER CHOOSES HOW MANY DICE TO ROLL*/
        numDefendingDice = getNumDefendingDice(toCountry, this);

        /* GET THE DEFENDING PLAYER */
        Player *defendingPlayer = nullptr;
        for (auto &i : *GameLoop::getInstance()->getAllPlayers()) {
            if (i->getPlayerId() == toCountry->getPlayerOwnerID()) {
                defendingPlayer = i;
                break;
            }
        }
        if (defendingPlayer == nullptr) {
            this->setPlayerState(PlayerState::IDLE);
            this->strategy->resetChoices();
            return PlayerAction::FAILED;
        }

        if (this->executeAttack(fromCountry, toCountry, defendingPlayer, numAttackingDice, numDefendingDice) == PlayerAction::SUCCEEDED) {
            std::cout << "\n[ATTACK SUCCEEDED] - Proceeding." << std::endl;
            continue;
        } else {
            std::cout << "\n[ATTACK FAILED] - Make sure that you chose appropriate values." << std::endl;
            continue;
        }
    } while (true);
}